

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool httplib::detail::redirect<httplib::ClientImpl>
               (ClientImpl *cli,Request *req,Response *res,string *path,string *location,
               Error *error)

{
  bool bVar1;
  ssize_t sVar2;
  int __flags;
  Response new_res;
  Request new_req;
  Response local_390;
  undefined1 local_288 [64];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_248;
  _Alloc_hider local_218;
  size_type local_210;
  size_t local_70;
  
  __flags = (int)location;
  Request::Request((Request *)local_288,req);
  std::__cxx11::string::_M_assign((string *)(local_288 + 0x20));
  local_70 = local_70 - 1;
  if (res->status == 0x12f) {
    bVar1 = std::operator!=(&req->method,"GET");
    if (bVar1) {
      bVar1 = std::operator!=(&req->method,"HEAD");
      if (bVar1) {
        std::__cxx11::string::assign(local_288);
        local_210 = 0;
        *local_218._M_p = '\0';
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::clear(&local_248);
      }
    }
  }
  local_390.version._M_dataplus._M_p = (pointer)&local_390.version.field_2;
  local_390.version._M_string_length = 0;
  local_390.version.field_2._M_local_buf[0] = '\0';
  local_390.status = -1;
  local_390.reason._M_dataplus._M_p = (pointer)&local_390.reason.field_2;
  local_390.reason._M_string_length = 0;
  local_390.reason.field_2._M_local_buf[0] = '\0';
  local_390.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_390.headers._M_t._M_impl.super__Rb_tree_header._M_header;
  local_390.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_390.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_390.headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_390.body._M_dataplus._M_p = (pointer)&local_390.body.field_2;
  local_390.body._M_string_length = 0;
  local_390.body.field_2._M_local_buf[0] = '\0';
  local_390.location._M_dataplus._M_p = (pointer)&local_390.location.field_2;
  local_390.location._M_string_length = 0;
  local_390.location.field_2._M_local_buf[0] = '\0';
  local_390.content_length_ = 0;
  local_390.content_provider_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_390.content_provider_.super__Function_base._M_functor._8_8_ = 0;
  local_390.content_provider_.super__Function_base._M_manager = (_Manager_type)0x0;
  local_390.content_provider_._M_invoker = (_Invoker_type)0x0;
  local_390.content_provider_resource_releaser_.super__Function_base._M_functor._M_unused._M_object
       = (void *)0x0;
  local_390.content_provider_resource_releaser_.super__Function_base._M_functor._8_8_ = 0;
  local_390.content_provider_resource_releaser_.super__Function_base._M_manager._0_2_ = 0;
  local_390.content_provider_resource_releaser_.super__Function_base._M_manager._2_6_ = 0;
  local_390.content_provider_resource_releaser_._M_invoker._0_2_ = 0;
  local_390._250_8_ = 0;
  local_390.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_390.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sVar2 = ClientImpl::send(cli,(int)local_288,&local_390,(size_t)error,__flags);
  if ((char)sVar2 != '\0') {
    Request::operator=(req,(Request *)local_288);
    Response::operator=(res,&local_390);
    if ((res->location)._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&res->location);
    }
  }
  Response::~Response(&local_390);
  Request::~Request((Request *)local_288);
  return (bool)(char)sVar2;
}

Assistant:

inline bool redirect(T &cli, Request &req, Response &res,
                     const std::string &path, const std::string &location,
                     Error &error) {
  Request new_req = req;
  new_req.path = path;
  new_req.redirect_count_ -= 1;

  if (res.status == 303 && (req.method != "GET" && req.method != "HEAD")) {
    new_req.method = "GET";
    new_req.body.clear();
    new_req.headers.clear();
  }

  Response new_res;

  auto ret = cli.send(new_req, new_res, error);
  if (ret) {
    req = new_req;
    res = new_res;

    if (res.location.empty()) res.location = location;
  }
  return ret;
}